

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_recursive_cte.cpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::CreatePlan(PhysicalPlanGenerator *this,LogicalCTERef *op)

{
  idx_t *piVar1;
  undefined8 uVar2;
  iterator __position;
  long lVar3;
  char cVar4;
  iterator iVar5;
  pointer pPVar6;
  PhysicalOperator *pPVar7;
  iterator iVar8;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
  _Var9;
  InvalidInputException *pIVar10;
  PhysicalOperatorType op_type;
  undefined1 local_50 [32];
  
  if (op->materialized_cte == CTE_MATERIALIZE_ALWAYS) {
    piVar1 = &op->cte_index;
    iVar5 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->materialized_ctes)._M_h,piVar1);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_50[0] = 0x1b;
      pPVar6 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
               operator->(&this->physical_plan);
      pPVar7 = PhysicalPlan::
               Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType,unsigned_long&,unsigned_long&>
                         (pPVar6,&op->chunk_types,local_50,
                          &(op->super_LogicalOperator).estimated_cardinality,piVar1);
      iVar8 = ::std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->recursive_cte_tables)._M_h,piVar1);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_50._0_8_ = local_50 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_50,"Referenced materialized CTE does not exist.","");
        InvalidInputException::InvalidInputException(pIVar10,(string *)local_50);
        __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      uVar2 = *(undefined8 *)
               ((long)iVar8.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
                      ._M_cur + 0x10);
      ::std::
      __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)(pPVar7 + 1),(pointer)0x0);
      *(undefined8 *)&pPVar7[1].type = uVar2;
      __position._M_current =
           *(reference_wrapper<const_duckdb::PhysicalOperator> **)
            ((long)iVar5.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
                   ._M_cur + 0x18);
      if (__position._M_current !=
          *(reference_wrapper<const_duckdb::PhysicalOperator> **)
           ((long)iVar5.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
                  ._M_cur + 0x20)) {
        (__position._M_current)->_M_data = pPVar7;
        *(long *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
                        ._M_cur + 0x18) =
             *(long *)((long)iVar5.
                             super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
                             ._M_cur + 0x18) + 8;
        return pPVar7;
      }
      local_50._0_8_ = pPVar7;
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
      ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator_const>>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator_const>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator_const>>>
                  *)((long)iVar5.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>_>,_false>
                           ._M_cur + 0x10),__position,
                 (reference_wrapper<const_duckdb::PhysicalOperator> *)local_50);
      return pPVar7;
    }
  }
  piVar1 = &op->cte_index;
  _Var9._M_cur = (__node_type *)
                 ::std::
                 _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->recursive_cte_tables)._M_h,piVar1);
  if (_Var9._M_cur == (__node_type *)0x0) {
    pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    local_50._0_8_ = local_50 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Referenced recursive CTE does not exist.","");
    InvalidInputException::InvalidInputException(pIVar10,(string *)local_50);
    __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (op->is_recurring == true) {
    _Var9._M_cur = (__node_type *)
                   ::std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(&(this->recurring_cte_tables)._M_h,piVar1);
    if (_Var9._M_cur == (__node_type *)0x0) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_50._0_8_ = local_50 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"RECURRING can only be used with USING KEY in recursive CTE.",""
                );
      InvalidInputException::InvalidInputException(pIVar10,(string *)local_50);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    cVar4 = (op->is_recurring & 1U) + 0x19;
  }
  else {
    cVar4 = '\x19';
  }
  lVar3 = *(long *)((long)&((_Var9._M_cur)->
                           super__Hash_node_value<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
                           ).
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>
                           ._M_storage._M_storage + 8);
  local_50[0] = cVar4;
  pPVar6 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
           operator->(&this->physical_plan);
  pPVar7 = PhysicalPlan::
           Make<duckdb::PhysicalColumnDataScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::PhysicalOperatorType&,unsigned_long&,unsigned_long&>
                     (pPVar6,(vector<duckdb::LogicalType,_true> *)(lVar3 + 0x10),local_50,
                      &(op->super_LogicalOperator).estimated_cardinality,piVar1);
  uVar2 = *(undefined8 *)
           ((long)&((_Var9._M_cur)->
                   super__Hash_node_value<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>,_false>
                   ).
                   super__Hash_node_value_base<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::ColumnDataCollection,_true>_>_>
                   ._M_storage._M_storage + 8);
  ::std::
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
           *)(pPVar7 + 1),(pointer)0x0);
  *(undefined8 *)&pPVar7[1].type = uVar2;
  return pPVar7;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::CreatePlan(LogicalCTERef &op) {
	D_ASSERT(op.children.empty());

	// Check if this LogicalCTERef is supposed to scan a materialized CTE.
	if (op.materialized_cte == CTEMaterialize::CTE_MATERIALIZE_ALWAYS) {
		// Lookup if there is a materialized CTE for the cte_index.
		auto materialized_cte = materialized_ctes.find(op.cte_index);

		// If this check fails, this is a reference to a materialized recursive CTE.
		if (materialized_cte != materialized_ctes.end()) {
			auto &chunk_scan = Make<PhysicalColumnDataScan>(op.chunk_types, PhysicalOperatorType::CTE_SCAN,
			                                                op.estimated_cardinality, op.cte_index);

			auto cte = recursive_cte_tables.find(op.cte_index);
			if (cte == recursive_cte_tables.end()) {
				throw InvalidInputException("Referenced materialized CTE does not exist.");
			}

			auto &cast_chunk_scan = chunk_scan.Cast<PhysicalColumnDataScan>();
			cast_chunk_scan.collection = cte->second.get();
			materialized_cte->second.push_back(cast_chunk_scan);
			return chunk_scan;
		}
	}

	// CreatePlan of a LogicalRecursiveCTE must have happened before.
	auto cte = recursive_cte_tables.find(op.cte_index);
	if (cte == recursive_cte_tables.end()) {
		throw InvalidInputException("Referenced recursive CTE does not exist.");
	}

	// If we found a recursive CTE and we want to scan the recurring table, we search for it,
	if (op.is_recurring) {
		cte = recurring_cte_tables.find(op.cte_index);
		if (cte == recurring_cte_tables.end()) {
			throw InvalidInputException("RECURRING can only be used with USING KEY in recursive CTE.");
		}
	}

	auto &types = cte->second.get()->Types();
	auto op_type =
	    op.is_recurring ? PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN : PhysicalOperatorType::RECURSIVE_CTE_SCAN;
	auto &chunk_scan = Make<PhysicalColumnDataScan>(types, op_type, op.estimated_cardinality, op.cte_index);
	auto &cast_chunk_scan = chunk_scan.Cast<PhysicalColumnDataScan>();
	cast_chunk_scan.collection = cte->second.get();
	return chunk_scan;
}